

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test::
~TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test
          (TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test *this)

{
  TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test *mem;
  TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_ThreeQuads_ThreeClosedTriplets_AllTriplets_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeQuads_ThreeClosedTriplets_AllTriplets)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, false);
	addQuad(Tile::FiveOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, true);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeQuads));
	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(6, r.doubling_factor);
}